

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int __thiscall
icu_63::UnicodeSet::clone
          (UnicodeSet *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UnicodeSet *this_00;
  
  this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)__fn);
  if (this_00 == (UnicodeSet *)0x0) {
    this_00 = (UnicodeSet *)0x0;
  }
  else {
    UnicodeSet(this_00,this);
  }
  return (int)this_00;
}

Assistant:

UnicodeFunctor* UnicodeSet::clone() const {
    return new UnicodeSet(*this);
}